

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O0

void __thiscall google::protobuf::io::Printer::Outdent(Printer *this)

{
  ulong uVar1;
  ulong uVar2;
  PrintOptions opts_00;
  bool bVar3;
  string_view local_38;
  undefined8 local_22;
  bool local_1a;
  undefined1 local_19 [8];
  PrintOptions opts;
  Printer *this_local;
  
  opts._1_8_ = this;
  PrintOptions::PrintOptions((PrintOptions *)local_19);
  local_19[2] = true;
  uVar1 = this->indent_;
  uVar2 = (this->options_).spaces_per_indent;
  local_22 = CONCAT53(local_19._3_5_,CONCAT12(1,local_19._0_2_));
  local_1a = (bool)opts.loc.
                   super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
                   _M_payload.
                   super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation>._0_1_
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"Outdent() without matching Indent()");
  opts_00.use_annotation_frames = local_1a;
  opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
       (undefined2)local_22;
  opts_00.checks_are_debug_only = (bool)local_22._2_1_;
  opts_00.use_substitution_map = (bool)local_22._3_1_;
  opts_00.use_curly_brace_substitutions = (bool)local_22._4_1_;
  opts_00.allow_digit_substitutions = (bool)local_22._5_1_;
  opts_00.strip_spaces_around_vars = (bool)local_22._6_1_;
  opts_00.strip_raw_string_indentation = (bool)local_22._7_1_;
  bVar3 = Validate(uVar2 <= uVar1,opts_00,local_38);
  if (bVar3) {
    this->indent_ = this->indent_ - (this->options_).spaces_per_indent;
  }
  return;
}

Assistant:

void Printer::Outdent() {
  PrintOptions opts;
  opts.checks_are_debug_only = true;
  if (!Validate(indent_ >= options_.spaces_per_indent, opts,
                "Outdent() without matching Indent()")) {
    return;
  }
  indent_ -= options_.spaces_per_indent;
}